

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialogPrivate::setDefault(QDialogPrivate *this,QPushButton *pushButton)

{
  QPushButton *pQVar1;
  bool bVar2;
  QWidget *pQVar3;
  QPushButton *p;
  qsizetype qVar4;
  const_reference ppQVar5;
  QWidget *pQVar6;
  QPushButton *in_RSI;
  QDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  bool hasMain;
  QDialog *q;
  QPushButton *pb;
  QList<QPushButton_*> list;
  undefined8 in_stack_ffffffffffffff98;
  FindChildOption flags;
  QWidget *pQVar7;
  undefined1 enable;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar8;
  uint in_stack_ffffffffffffffb4;
  QFlagsStorage<Qt::FindChildOption> in_stack_ffffffffffffffdc;
  QList<QPushButton_*> local_20;
  long local_8;
  
  flags = (FindChildOption)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = &q_func(in_RDI)->super_QWidget;
  in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QPushButton **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = pQVar3;
  QFlags<Qt::FindChildOption>::QFlags((QFlags<Qt::FindChildOption> *)in_RDI,flags);
  QObject::findChildren<QPushButton*>
            ((QObject *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (FindChildOptions)in_stack_ffffffffffffffdc.i);
  iVar8 = 0;
  while( true ) {
    p = (QPushButton *)(long)iVar8;
    qVar4 = QList<QPushButton_*>::size(&local_20);
    enable = (undefined1)((ulong)pQVar7 >> 0x38);
    if (qVar4 <= (long)p) break;
    ppQVar5 = QList<QPushButton_*>::at((QList<QPushButton_*> *)in_RDI,(qsizetype)p);
    pQVar1 = *ppQVar5;
    pQVar6 = QWidget::window((QWidget *)CONCAT44(in_stack_ffffffffffffffb4,iVar8));
    if (pQVar6 == pQVar3) {
      bVar2 = ::operator==((QPushButton **)in_RDI,(QPointer<QPushButton> *)p);
      if (bVar2) {
        in_stack_ffffffffffffffb4 = CONCAT13(1,(int3)in_stack_ffffffffffffffb4);
      }
      if (pQVar1 != in_RSI) {
        QPushButton::setDefault
                  ((QPushButton *)CONCAT44(in_stack_ffffffffffffffb4,iVar8),
                   SUB81((ulong)pQVar7 >> 0x38,0));
      }
    }
    iVar8 = iVar8 + 1;
  }
  if ((in_RSI == (QPushButton *)0x0) && ((in_stack_ffffffffffffffb4 & 0x1000000) != 0)) {
    QPointer<QPushButton>::operator->((QPointer<QPushButton> *)0x743945);
    QPushButton::setDefault((QPushButton *)CONCAT44(in_stack_ffffffffffffffb4,iVar8),(bool)enable);
  }
  if ((in_stack_ffffffffffffffb4 & 0x1000000) == 0) {
    QPointer<QPushButton>::operator=((QPointer<QPushButton> *)in_RDI,p);
  }
  QList<QPushButton_*>::~QList((QList<QPushButton_*> *)0x743979);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogPrivate::setDefault(QPushButton *pushButton)
{
    Q_Q(QDialog);
    bool hasMain = false;
    QList<QPushButton*> list = q->findChildren<QPushButton*>();
    for (int i=0; i<list.size(); ++i) {
        QPushButton *pb = list.at(i);
        if (pb->window() == q) {
            if (pb == mainDef)
                hasMain = true;
            if (pb != pushButton)
                pb->setDefault(false);
        }
    }
    if (!pushButton && hasMain)
        mainDef->setDefault(true);
    if (!hasMain)
        mainDef = pushButton;
}